

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivFilterTest(Gia_Man_t *p)

{
  Vec_Int_t *vPoIds;
  int iVar1;
  
  vPoIds = Vec_IntAlloc(1000);
  for (iVar1 = 2; iVar1 != 0x16; iVar1 = iVar1 + 2) {
    Vec_IntPush(vPoIds,(p->vCos->nSize - p->nRegs) + iVar1);
    printf("%d ",(ulong)(uint)((p->vCos->nSize - p->nRegs) + iVar1));
  }
  putchar(10);
  Gia_ManEquivFilter(p,vPoIds,1);
  Vec_IntFree(vPoIds);
  return;
}

Assistant:

void Gia_ManEquivFilterTest( Gia_Man_t * p )
{
    Vec_Int_t * vPoIds;
    int i;
    vPoIds = Vec_IntAlloc( 1000 );
    for ( i = 0; i < 10; i++ )
    {
        Vec_IntPush( vPoIds, Gia_ManPoNum(p) + 2 * i + 2 );
        printf( "%d ", Gia_ManPoNum(p) + 2*i + 2 );
    }
    printf( "\n" );
    Gia_ManEquivFilter( p, vPoIds, 1 );
    Vec_IntFree( vPoIds );
}